

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Abc_Cex_t * Vta_ManRefineAbstraction(Vta_Man_t *p,int f)

{
  sat_solver2 *s;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Vta_Obj_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Vta_Obj_t *pVVar8;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vta_Obj_t *pVVar9;
  uint *puVar10;
  void *pvVar11;
  Vec_Int_t *p_03;
  Vta_Obj_t *pThis;
  Abc_Cex_t *pAVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  Vec_Ptr_t *p_04;
  Vta_Obj_t *local_80;
  Vta_Obj_t *local_48;
  Vta_Obj_t *local_40;
  Vta_Obj_t *local_38;
  
  p_00 = Vta_ManCollectNodes(p,f);
  for (iVar14 = 0; iVar14 < p_00->nSize; iVar14 = iVar14 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar14);
    pVVar6 = Vta_ManObj(p,iVar2);
    if ((pVVar6 == (Vta_Obj_t *)0x0) ||
       (pGVar7 = Gia_ManObj(p->pGia,pVVar6->iObj), pGVar7 == (Gia_Obj_t *)0x0)) break;
    *(uint *)&pVVar6->field_0xc = *(uint *)&pVVar6->field_0xc | 0xfffffff;
    s = p->pSat;
    iVar2 = Vta_ObjId(p,pVVar6);
    iVar2 = sat_solver2_var_value(s,iVar2);
    *(uint *)&pVVar6->field_0xc =
         (*(uint *)&pVVar6->field_0xc & 0x4fffffff) + (uint)(iVar2 != 0) * 0x10000000 + 0x10000000;
  }
  uVar3 = Vec_IntEntryLast(p_00);
  pVVar6 = (Vta_Obj_t *)(ulong)uVar3;
  pVVar8 = Vta_ManObj(p,uVar3);
  *(uint *)&pVVar8->field_0xc = (*(uint *)&pVVar8->field_0xc & 0xf0000000) + 1;
  p_01 = Vec_PtrAlloc(0x3f7);
  p_02 = Vec_PtrAlloc(0x3f8);
  iVar14 = p_00->nSize;
  while (0 < iVar14) {
    iVar2 = iVar14 + -1;
    uVar3 = Vec_IntEntry(p_00,iVar2);
    pVVar6 = (Vta_Obj_t *)(ulong)uVar3;
    pVVar8 = Vta_ManObj(p,uVar3);
    if (pVVar8 == (Vta_Obj_t *)0x0) break;
    pVVar6 = (Vta_Obj_t *)(ulong)(uint)pVVar8->iObj;
    pVVar9 = (Vta_Obj_t *)Gia_ManObj(p->pGia,pVVar8->iObj);
    if (pVVar9 == (Vta_Obj_t *)0x0) break;
    uVar3 = *(uint *)&pVVar8->field_0xc;
    if ((~uVar3 & 0xfffffff) == 0) {
      __assert_fail("pThis->Prio < VTA_LARGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x280,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    uVar1._0_4_ = pVVar9->iObj;
    uVar1._4_4_ = pVVar9->iFrame;
    if ((~uVar1 & 0x1fffffff1fffffff) == 0) {
LAB_00500110:
      *(uint *)&pVVar8->field_0xc = uVar3 & 0xf0000000;
      pVVar8 = pVVar6;
LAB_0050011a:
      pVVar6 = pVVar8;
      iVar14 = iVar14 + -1;
    }
    else {
      pVVar6 = pVVar9;
      iVar4 = Gia_ObjIsPi(p->pGia,(Gia_Obj_t *)pVVar9);
      if (iVar4 != 0) {
        uVar3 = *(uint *)&pVVar8->field_0xc;
        goto LAB_00500110;
      }
      if ((pVVar9->iObj < 0 || (~pVVar9->iObj & 0x1fffffffU) == 0) &&
         (iVar4 = Gia_ObjIsRo(p->pGia,(Gia_Obj_t *)pVVar9), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x288,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      if ((*(uint *)&pVVar8->field_0xc >> 0x1e & 1) == 0) {
        if ((*(uint *)&pVVar8->field_0xc & 0xfffffff) == 0) {
          __assert_fail("pThis->Prio > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x28b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        iVar2 = Vta_ManObjIsUsed(p,pVVar8->iObj);
        p_04 = p_02;
        if (iVar2 != 0) {
          p_04 = p_01;
        }
        Vec_PtrPush(p_04,pVVar8);
        goto LAB_0050011a;
      }
      pVVar6 = pVVar8;
      Vta_ObjPreds(p,pVVar8,(Gia_Obj_t *)pVVar9,&local_40,&local_48);
      if (local_40 != (Vta_Obj_t *)0x0) {
        uVar13 = *(uint *)&local_40->field_0xc & 0xfffffff;
        uVar3 = (*(uint *)&pVVar8->field_0xc & 0xfffffff) + 1;
        if (uVar13 < uVar3) {
          uVar3 = uVar13;
        }
        pVVar6 = (Vta_Obj_t *)(ulong)uVar3;
        *(uint *)&local_40->field_0xc = *(uint *)&local_40->field_0xc & 0xf0000000 | uVar3;
      }
      local_80 = (Vta_Obj_t *)0x0;
      iVar14 = iVar2;
      if (local_48 != (Vta_Obj_t *)0x0) {
        uVar13 = *(uint *)&local_48->field_0xc & 0xfffffff;
        uVar3 = (*(uint *)&pVVar8->field_0xc & 0xfffffff) + 1;
        if (uVar13 < uVar3) {
          uVar3 = uVar13;
        }
        pVVar6 = (Vta_Obj_t *)(ulong)uVar3;
        *(uint *)&local_48->field_0xc = *(uint *)&local_48->field_0xc & 0xf0000000 | uVar3;
        local_80 = local_48;
      }
    }
  }
  uVar3 = p_01->nSize;
  uVar15 = 0;
  uVar13 = 0;
  if (0 < (int)uVar3) {
    uVar13 = uVar3;
  }
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    pVVar6 = (Vta_Obj_t *)(ulong)uVar15;
    puVar10 = (uint *)Vec_PtrEntry(p_01,uVar15);
    puVar10[3] = puVar10[3] & 0xf0000000 | *puVar10 & 0xfffffff;
  }
  uVar16 = 0;
  uVar15 = p_02->nSize;
  if (p_02->nSize < 1) {
    uVar15 = uVar16;
  }
  for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
    pVVar6 = (Vta_Obj_t *)(ulong)uVar16;
    puVar10 = (uint *)Vec_PtrEntry(p_02,uVar16);
    puVar10[3] = puVar10[3] & 0xf0000000 | *puVar10 & 0xfffffff;
  }
  Vec_PtrSort(p_01,(_func_int_varargs *)pVVar6);
  Vec_PtrSort(p_02,(_func_int_varargs *)pVVar6);
  if (1 < (int)uVar3) {
    local_40 = (Vta_Obj_t *)Vec_PtrEntry(p_01,0);
    local_80 = (Vta_Obj_t *)p_01->pArray[(ulong)uVar3 - 1];
    if ((*(uint *)&local_80->field_0xc & 0xfffffff) < (*(uint *)&local_40->field_0xc & 0xfffffff)) {
      __assert_fail("pThis0->Prio <= pThis1->Prio",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x2ca,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
  }
  for (uVar3 = 1; uVar3 - uVar13 != 1; uVar3 = uVar3 + 1) {
    pvVar11 = Vec_PtrEntry(p_01,uVar3 - 1);
    *(uint *)((long)pvVar11 + 0xc) = *(uint *)((long)pvVar11 + 0xc) & 0xf0000000 | uVar3 & 0xfffffff
    ;
  }
  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
    pvVar11 = Vec_PtrEntry(p_02,uVar16);
    *(uint *)((long)pvVar11 + 0xc) =
         *(uint *)((long)pvVar11 + 0xc) & 0xf0000000 | uVar3 + uVar16 & 0xfffffff;
  }
  for (iVar14 = 0; iVar14 < p_00->nSize; iVar14 = iVar14 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar14);
    pVVar6 = Vta_ManObj(p,iVar2);
    if ((pVVar6 == (Vta_Obj_t *)0x0) ||
       (pGVar7 = Gia_ManObj(p->pGia,pVVar6->iObj), pGVar7 == (Gia_Obj_t *)0x0)) break;
    uVar3 = *(uint *)&pVVar6->field_0xc;
    if ((int)uVar3 < 0) {
      __assert_fail("pThis->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x2d8,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    if ((~uVar3 & 0xfffffff) == 0) {
      __assert_fail("pThis->Prio < VTA_LARGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x2d9,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    if (0x3fffffff < uVar3) {
      if ((uVar3 & 0x30000000) == 0) {
        __assert_fail("pThis->Value != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x2de,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      if ((~*(uint *)pGVar7 & 0x1fffffff) == 0 || (int)*(uint *)pGVar7 < 0) {
        iVar2 = Gia_ObjIsRo(p->pGia,pGVar7);
        if (iVar2 == 0) {
          if ((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x305,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
        }
        else if (0 < pVVar6->iFrame) {
          pGVar7 = Gia_ObjRoToRi(p->pGia,pGVar7);
          iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar7);
          pVVar8 = Vga_ManFind(p,iVar2,pVVar6->iFrame + -1);
          if (pVVar8 == (Vta_Obj_t *)0x0) {
            __assert_fail("pThis0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2fc,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          uVar15 = *(uint *)&pVVar8->field_0xc;
          uVar3 = *(uint *)&pVVar6->field_0xc;
LAB_005005d3:
          uVar15 = uVar3 & 0xf0000000 | uVar15 & 0xfffffff;
          goto LAB_005005d6;
        }
        uVar15 = *(uint *)&pVVar6->field_0xc & 0xf0000000;
      }
      else {
        iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar7);
        pVVar8 = Vga_ManFind(p,iVar2,pVVar6->iFrame);
        iVar2 = Gia_ObjFaninId1p(p->pGia,pGVar7);
        local_80 = Vga_ManFind(p,iVar2,pVVar6->iFrame);
        if ((pVVar8 == (Vta_Obj_t *)0x0) || (local_80 == (Vta_Obj_t *)0x0)) {
          __assert_fail("pThis0 && pThis1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x2e4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        uVar3 = *(uint *)&pVVar6->field_0xc;
        uVar15 = uVar3 >> 0x1c & 3;
        if (uVar15 == 1) {
          uVar1 = *(ulong *)pGVar7;
          iVar2 = Vta_ValIs0(pVVar8,(uint)(uVar1 >> 0x1d) & 1);
          iVar4 = Vta_ValIs0(local_80,(uint)(uVar1 >> 0x3d) & 1);
          if (iVar2 == 0) {
            if (iVar4 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x2f2,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            uVar15 = *(uint *)&local_80->field_0xc;
            goto LAB_005005d3;
          }
          uVar15 = *(uint *)&pVVar8->field_0xc & 0xfffffff;
          if (iVar4 != 0) {
            uVar16 = *(uint *)&local_80->field_0xc & 0xfffffff;
            if (uVar15 < uVar16) {
              uVar16 = uVar15;
            }
            uVar15 = uVar3 & 0xf0000000 | uVar16;
            goto LAB_005005d6;
          }
        }
        else {
          if (uVar15 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2f4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          uVar1 = *(ulong *)pGVar7;
          iVar2 = Vta_ValIs1(pVVar8,(uint)(uVar1 >> 0x1d) & 1);
          if ((iVar2 == 0) || (iVar2 = Vta_ValIs1(local_80,(uint)(uVar1 >> 0x3d) & 1), iVar2 == 0))
          {
            __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2e7,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          uVar16 = *(uint *)&pVVar8->field_0xc & 0xfffffff;
          uVar15 = *(uint *)&local_80->field_0xc & 0xfffffff;
          if (uVar15 < uVar16) {
            uVar15 = uVar16;
          }
        }
        uVar15 = uVar3 & 0xf0000000 | uVar15;
      }
LAB_005005d6:
      *(uint *)&pVVar6->field_0xc = uVar15;
    }
  }
  local_48 = local_80;
  iVar14 = Vec_IntEntryLast(p_00);
  pVVar6 = Vta_ManObj(p,iVar14);
  pVVar6->field_0xf = pVVar6->field_0xf | 0x80;
  p_03 = Vec_IntAlloc(100);
  iVar14 = p_00->nSize;
  while (0 < iVar14) {
    iVar14 = iVar14 + -1;
    iVar2 = Vec_IntEntry(p_00,iVar14);
    pVVar8 = Vta_ManObj(p,iVar2);
    if ((pVVar8 == (Vta_Obj_t *)0x0) ||
       (pGVar7 = Gia_ManObj(p->pGia,pVVar8->iObj), pGVar7 == (Gia_Obj_t *)0x0)) break;
    uVar3 = *(uint *)&pVVar8->field_0xc;
    if ((int)uVar3 < 0) {
      *(uint *)&pVVar8->field_0xc = uVar3 & 0x7fffffff;
      if ((*(uint *)&pVVar6->field_0xc & 0xfffffff) < (uVar3 & 0xfffffff)) {
        __assert_fail("pThis->Prio >= 0 && pThis->Prio <= pTop->Prio",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x311,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      if ((uVar3 >> 0x1e & 1) == 0) {
        if (((((int)*(uint *)pGVar7 < 0 || (~*(uint *)pGVar7 & 0x1fffffff) == 0) &&
             (iVar2 = Gia_ObjIsRo(p->pGia,pGVar7), iVar2 == 0)) &&
            ((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0)) &&
           (iVar2 = Gia_ObjIsPi(p->pGia,pGVar7), iVar2 == 0)) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x315,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        iVar2 = Vta_ObjId(p,pVVar8);
        Vec_IntPush(p_03,iVar2);
      }
      else {
        if ((uVar3 & 0x30000000) == 0) {
          __assert_fail("pThis->Value != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x31a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        if ((~*(uint *)pGVar7 & 0x1fffffff) == 0 || (int)*(uint *)pGVar7 < 0) {
          iVar2 = Gia_ObjIsRo(p->pGia,pGVar7);
          if (iVar2 == 0) {
            if ((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x358,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
          }
          else if (0 < pVVar8->iFrame) {
            pGVar7 = Gia_ObjRoToRi(p->pGia,pGVar7);
            iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar7);
            pVVar9 = Vga_ManFind(p,iVar2,pVVar8->iFrame + -1);
            if (pVVar9 == (Vta_Obj_t *)0x0) {
              __assert_fail("pThis0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x352,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            uVar3 = *(uint *)&pVVar9->field_0xc;
            *(uint *)&pVVar9->field_0xc = uVar3 | 0x80000000;
            if (((uVar3 ^ *(uint *)&pVVar8->field_0xc) & 0xfffffff) != 0) {
              __assert_fail("pThis0->Prio == pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x354,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
          }
        }
        else {
          iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar7);
          pVVar9 = Vga_ManFind(p,iVar2,pVVar8->iFrame);
          iVar2 = Gia_ObjFaninId1p(p->pGia,pGVar7);
          pThis = Vga_ManFind(p,iVar2,pVVar8->iFrame);
          if ((pVVar9 == (Vta_Obj_t *)0x0) || (pThis == (Vta_Obj_t *)0x0)) {
            __assert_fail("pThis0 && pThis1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,800,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          uVar3 = *(uint *)&pVVar8->field_0xc;
          uVar15 = uVar3 >> 0x1c & 3;
          if (uVar15 == 1) {
            uVar1 = *(ulong *)pGVar7;
            local_38 = pVVar9;
            iVar2 = Vta_ValIs0(pVVar9,(uint)(uVar1 >> 0x1d) & 1);
            iVar4 = Vta_ValIs0(pThis,(uint)(uVar1 >> 0x3d) & 1);
            if (iVar2 == 0) {
              if (iVar4 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x348,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              uVar3 = *(uint *)&pThis->field_0xc;
              *(uint *)&pThis->field_0xc = uVar3 | 0x80000000;
              if (((uVar3 ^ *(uint *)&pVVar8->field_0xc) & 0xfffffff) != 0) {
                __assert_fail("pThis1->Prio == pThis->Prio",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x346,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
            else {
              uVar3 = *(uint *)&local_38->field_0xc;
              if (iVar4 == 0) {
                *(uint *)&local_38->field_0xc = uVar3 | 0x80000000;
                if (((uVar3 ^ *(uint *)&pVVar8->field_0xc) & 0xfffffff) != 0) {
                  __assert_fail("pThis0->Prio == pThis->Prio",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x341,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
              }
              else if ((-1 < (int)uVar3) && (uVar15 = *(uint *)&pThis->field_0xc, -1 < (int)uVar15))
              {
                if ((uVar15 & 0xfffffff) < (uVar3 & 0xfffffff)) {
                  *(uint *)&pThis->field_0xc = uVar15 | 0x80000000;
                  if (((uVar15 ^ *(uint *)&pVVar8->field_0xc) & 0xfffffff) != 0) {
                    __assert_fail("pThis1->Prio == pThis->Prio",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                  ,0x33b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                  }
                }
                else {
                  *(uint *)&local_38->field_0xc = uVar3 | 0x80000000;
                  if (((uVar3 ^ *(uint *)&pVVar8->field_0xc) & 0xfffffff) != 0) {
                    __assert_fail("pThis0->Prio == pThis->Prio",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                  ,0x336,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                  }
                }
              }
            }
          }
          else {
            if (uVar15 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x34a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            uVar1 = *(ulong *)pGVar7;
            iVar2 = Vta_ValIs1(pVVar9,(uint)(uVar1 >> 0x1d) & 1);
            if ((iVar2 == 0) || (iVar2 = Vta_ValIs1(pThis,(uint)(uVar1 >> 0x3d) & 1), iVar2 == 0)) {
              __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x323,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            uVar3 = uVar3 & 0xfffffff;
            if (uVar3 < (*(uint *)&pVVar9->field_0xc & 0xfffffff)) {
              __assert_fail("pThis0->Prio <= pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x324,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            if (uVar3 < (*(uint *)&pThis->field_0xc & 0xfffffff)) {
              __assert_fail("pThis1->Prio <= pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x325,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            *(uint *)&pVVar9->field_0xc = *(uint *)&pVVar9->field_0xc | 0x80000000;
            pThis->field_0xf = pThis->field_0xf | 0x80;
          }
        }
      }
    }
  }
  if (p->pPars->fAddLayer != 0) {
    iVar14 = p_03->nSize;
    iVar2 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; iVar14 != iVar2; iVar2 = iVar2 + 1) {
      iVar4 = Vec_IntEntry(p_03,iVar2);
      pVVar8 = Vta_ManObj(p,iVar4);
      if (pVVar8 == (Vta_Obj_t *)0x0) break;
      if ((int)*(uint *)&pVVar8->field_0xc < 0) {
        __assert_fail("pThis->fVisit == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x360,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      *(uint *)&pVVar8->field_0xc = *(uint *)&pVVar8->field_0xc | 0x80000000;
    }
    for (uVar3 = 0; uVar13 != uVar3; uVar3 = uVar3 + 1) {
      pVVar8 = (Vta_Obj_t *)Vec_PtrEntry(p_01,uVar3);
      if (-1 < *(int *)&pVVar8->field_0xc) {
        iVar14 = Vta_ObjId(p,pVVar8);
        Vec_IntPush(p_03,iVar14);
      }
    }
    iVar14 = p_03->nSize;
    iVar2 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; iVar14 != iVar2; iVar2 = iVar2 + 1) {
      iVar4 = Vec_IntEntry(p_03,iVar2);
      pVVar8 = Vta_ManObj(p,iVar4);
      if (pVVar8 == (Vta_Obj_t *)0x0) break;
      pVVar8->field_0xf = pVVar8->field_0xf & 0x7f;
    }
  }
  Vec_PtrFree(p_01);
  Vec_PtrFree(p_02);
  if ((*(uint *)&pVVar6->field_0xc & 0xfffffff) == 0) {
    pAVar12 = Vga_ManDeriveCex(p);
    iVar14 = p_03->nSize;
  }
  else {
    iVar14 = p_03->nSize;
    iVar4 = 0;
    iVar2 = 0;
    if (0 < iVar14) {
      iVar2 = iVar14;
    }
    for (; iVar2 != iVar4; iVar4 = iVar4 + 1) {
      iVar5 = Vec_IntEntry(p_03,iVar4);
      pVVar6 = Vta_ManObj(p,iVar5);
      if ((pVVar6 == (Vta_Obj_t *)0x0) ||
         (pGVar7 = Gia_ManObj(p->pGia,pVVar6->iObj), pGVar7 == (Gia_Obj_t *)0x0)) break;
      iVar5 = Gia_ObjIsPi(p->pGia,pGVar7);
      if (iVar5 == 0) {
        Vga_ManAddClausesOne(p,pVVar6->iObj,pVVar6->iFrame);
      }
    }
    sat_solver2_simplify(p->pSat);
    pAVar12 = (Abc_Cex_t *)0x0;
  }
  p->nObjAdded = p->nObjAdded + iVar14;
  Vec_IntFree(p_03);
  return pAVar12;
}

Assistant:

Abc_Cex_t * Vta_ManRefineAbstraction( Vta_Man_t * p, int f )
{
    int fVerify = 0;
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOrder, * vTermsToAdd;
    Vec_Ptr_t * vTermsUsed, * vTermsUnused;
    Vta_Obj_t * pThis, * pThis0, * pThis1, * pTop;
    Gia_Obj_t * pObj;
    int i, Counter;

    if ( fVerify )
    Vta_ManSatVerify( p );

    // collect nodes in a topological order
    vOrder = Vta_ManCollectNodes( p, f );
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        pThis->Prio = VTA_LARGE;
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
        pThis->fVisit = 0;
    }

    // verify
    if ( fVerify )
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }

    // compute distance in reverse order
    pThis = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pThis->Prio  = 1;
    // collect used and unused terms
    vTermsUsed   = Vec_PtrAlloc( 1015 );
    vTermsUnused = Vec_PtrAlloc( 1016 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        // there is no unreachable states
        assert( pThis->Prio < VTA_LARGE );
        // skip constants and PIs
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
        {
            pThis->Prio = 0; // set highest priority
            continue;
        }
        // collect terminals
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
        if ( !pThis->fAdded )
        {
            assert( pThis->Prio > 0 );
            if ( Vta_ManObjIsUsed(p, pThis->iObj) )
                Vec_PtrPush( vTermsUsed, pThis );
            else
                Vec_PtrPush( vTermsUnused, pThis );
            continue;
        }
        // propagate
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) 
            pThis0->Prio = Abc_MinInt( pThis0->Prio, pThis->Prio + 1 );
        if ( pThis1 ) 
            pThis1->Prio = Abc_MinInt( pThis1->Prio, pThis->Prio + 1 );
    }

/*
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
        if ( pThis->Prio > 0 )
            pThis->Prio = 10;
*/
/*
    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
*/


    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = pThis->iObj;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = pThis->iObj;


    // objects with equal distance should receive priority based on number
    // those objects whose prototypes have been added in other timeframes
    // should have higher priority than the current object
    Vec_PtrSort( vTermsUsed,   (int (*)(void))Vta_ManComputeDepthIncrease );
    Vec_PtrSort( vTermsUnused, (int (*)(void))Vta_ManComputeDepthIncrease );
    if ( Vec_PtrSize(vTermsUsed) > 1 )
    {
        pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUsed, 0);
        pThis1 = (Vta_Obj_t *)Vec_PtrEntryLast(vTermsUsed);
        assert( pThis0->Prio <= pThis1->Prio );
    }
    // assign the priority based on these orders
    Counter = 1;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = Counter++;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = Counter++;
//    Abc_Print( 1, "Used %d  Unused %d\n", Vec_PtrSize(vTermsUsed), Vec_PtrSize(vTermsUnused) );


    // propagate in the direct order
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        assert( pThis->Prio < VTA_LARGE );
        // skip terminal objects
        if ( !pThis->fAdded )
            continue;
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                pThis->Prio = Abc_MaxInt( pThis0->Prio, pThis1->Prio );
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = Abc_MinInt( pThis0->Prio, pThis1->Prio ); // choice!!!
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Prio = pThis0->Prio;
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = pThis1->Prio;
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis->Prio = pThis0->Prio;
            }
            else
                pThis->Prio = 0;
        }
        else if ( Gia_ObjIsConst0(pObj) )
            pThis->Prio = 0;
        else
            assert( 0 );
    }

    // select important values
    pTop = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pTop->fVisit = 1;
    vTermsToAdd = Vec_IntAlloc( 100 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fVisit )
            continue;
        pThis->fVisit = 0;
        assert( pThis->Prio >= 0 && pThis->Prio <= pTop->Prio );
        // skip terminal objects
        if ( !pThis->fAdded )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) );
            Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
            continue;
        }
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                assert( pThis0->Prio <= pThis->Prio );
                assert( pThis1->Prio <= pThis->Prio );
                pThis0->fVisit = 1;
                pThis1->fVisit = 1;
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    if ( pThis0->fVisit )
                    {
                    }
                    else if ( pThis1->fVisit )
                    {
                    }
                    else if ( pThis0->Prio <= pThis1->Prio ) // choice!!!
                    {
                        pThis0->fVisit = 1;
                        assert( pThis0->Prio == pThis->Prio );
                    }
                    else
                    {
                        pThis1->fVisit = 1;
                        assert( pThis1->Prio == pThis->Prio );
                    }
                }
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                {
                    pThis0->fVisit = 1;
                    assert( pThis0->Prio == pThis->Prio );
                }
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    pThis1->fVisit = 1;
                    assert( pThis1->Prio == pThis->Prio );
                }
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis0->fVisit = 1;
                assert( pThis0->Prio == pThis->Prio );
            }
        }
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
    }

    if ( p->pPars->fAddLayer )
    {
        // mark those currently included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
        {
            assert( pThis->fVisit == 0 );
            pThis->fVisit = 1;
        }
        // add used terms, which have close relationship
        Counter = Vec_IntSize(vTermsToAdd);
        Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        {
            if ( pThis->fVisit )
                continue;
    //        Vta_ObjPreds( p, pThis, Gia_ManObj(p->pGia, pThis->iObj), &pThis0, &pThis1 );
    //        if ( (pThis0 && (pThis0->fAdded || pThis0->fVisit)) || (pThis1 && (pThis1->fAdded || pThis1->fVisit)) )
                Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
        }
        // remove those currenty included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
            pThis->fVisit = 0;
    }
//    printf( "\n%d -> %d\n", Counter, Vec_IntSize(vTermsToAdd) );
//Vec_IntReverseOrder( vTermsToAdd );
//Vec_IntSort( vTermsToAdd, 1 );


    // cleanup
    Vec_PtrFree( vTermsUsed );
    Vec_PtrFree( vTermsUnused );


    if ( fVerify )
    {
    // verify
    Vta_ManForEachObjVec( vOrder, p, pThis, i )
        pThis->Value = VTA_VARX;
    Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
    {
        assert( !pThis->fAdded );
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
    }
    // simulate 
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        if ( !pThis->fAdded )
            continue;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR1;
            else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR0;
            else
                pThis->Value = VTA_VARX;
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR0;
                else if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR1;
                else
                    pThis->Value = VTA_VARX;
            }
            else
            {
                pThis->Value = VTA_VAR0;
            }
        }
        else if ( Gia_ObjIsConst0(pObj) )
        {
            pThis->Value = VTA_VAR0;
        }
        else assert( 0 );
        // double check the solver
        assert( pThis->Value == VTA_VARX || (int)pThis->Value == (sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0) );
    }

    // check the output
    if ( !Vta_ValIs1(pTop, Gia_ObjFaninC0(Gia_ManPo(p->pGia, 0))) )
        Abc_Print( 1, "Vta_ManRefineAbstraction(): Terminary simulation verification failed!\n" );
//    else
//        Abc_Print( 1, "Verification OK.\n" );
    }


    // produce true counter-example
    if ( pTop->Prio == 0 )
        pCex = Vga_ManDeriveCex( p );
    else
    {
//       Vta_ManProfileAddition( p, vTermsToAdd );

        Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
            if ( !Gia_ObjIsPi(p->pGia, pObj) )
                Vga_ManAddClausesOne( p, pThis->iObj, pThis->iFrame );
        sat_solver2_simplify( p->pSat );
    }
    p->nObjAdded += Vec_IntSize(vTermsToAdd);
    Vec_IntFree( vTermsToAdd );
    return pCex;
}